

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

fxp_handle * fxp_opendir_recv(sftp_packet *pktin,sftp_request *req)

{
  fxp_handle *pfVar1;
  
  safefree(req);
  if (pktin->type == 0x66) {
    pfVar1 = fxp_got_handle(pktin);
    return pfVar1;
  }
  fxp_got_status(pktin);
  sftp_pkt_free(pktin);
  return (fxp_handle *)0x0;
}

Assistant:

struct fxp_handle *fxp_opendir_recv(struct sftp_packet *pktin,
                                    struct sftp_request *req)
{
    sfree(req);
    if (pktin->type == SSH_FXP_HANDLE) {
        return fxp_got_handle(pktin);
    } else {
        fxp_got_status(pktin);
        sftp_pkt_free(pktin);
        return NULL;
    }
}